

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O1

bool json::save<one_int_var>(ostream *out,one_int_var *t,int tabs)

{
  SaveObject serializer;
  char local_29;
  SaveObject local_28;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"{\n",2);
  local_28.tabs = tabs + 1;
  local_28.first = true;
  local_28.out = out;
  SaveObject::process<int>(&local_28,"val",&t->val);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
  if (0 < tabs) {
    do {
      local_29 = '\t';
      std::__ostream_insert<char,std::char_traits<char>>(out,&local_29,1);
      tabs = tabs + -1;
    } while (tabs != 0);
  }
  local_29 = '}';
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_29,1);
  return ((byte)out[*(long *)(*(long *)out + -0x18) + 0x20] & 5) == 0;
}

Assistant:

bool save(std::ostream& out, T& t, int tabs) {
	out << "{\n";
	SaveObject serializer(out, tabs + 1);
	serialize(serializer, t); // serialize should be defined for type T
	out << "\n";
	for (int i = 0; i < tabs; ++i) out << '\t';
	out << '}';
	return !out.fail();
}